

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QRawFontPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRawFontPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QRawFontPrivate *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QRawFontPrivate> *in_RDI;
  void *in_R8;
  QRawFontPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x792edf);
  Qt::totally_ordered_wrapper<QRawFontPrivate_*>::operator->
            ((totally_ordered_wrapper<QRawFontPrivate_*> *)0x792ee9);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x792ef5);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QRawFontPrivate_*>::get(&in_RDI->d),
     pQVar3 != (QRawFontPrivate *)0x0)) {
    QRawFontPrivate::~QRawFontPrivate((QRawFontPrivate *)0x792f18);
    operator_delete(pQVar3,0x18);
  }
  Qt::totally_ordered_wrapper<QRawFontPrivate_*>::reset
            (&in_RDI->d,(QRawFontPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}